

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int xmlCtxtResetPush(xmlParserCtxtPtr ctxt,char *chunk,int size,char *filename,char *encoding)

{
  xmlChar *pxVar1;
  xmlCharEncoding enc;
  xmlParserInputBufferPtr in;
  char *pcVar2;
  xmlParserInputPtr pxVar3;
  xmlChar *pxVar4;
  size_t base;
  xmlCharEncodingHandlerPtr handler;
  
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    return 1;
  }
  enc = XML_CHAR_ENCODING_NONE;
  if (((chunk != (char *)0x0) && (enc = XML_CHAR_ENCODING_NONE, 3 < size)) &&
     (encoding == (char *)0x0)) {
    enc = xmlDetectCharEncoding((uchar *)chunk,size);
  }
  in = xmlAllocParserInputBuffer(enc);
  if (in == (xmlParserInputBufferPtr)0x0) {
    return 1;
  }
  xmlCtxtReset(ctxt);
  if (filename == (char *)0x0) {
    ctxt->directory = (char *)0x0;
    pxVar3 = xmlNewInputStream(ctxt);
    if (pxVar3 == (xmlParserInputPtr)0x0) goto LAB_00166976;
    pxVar4 = (xmlChar *)0x0;
  }
  else {
    pcVar2 = xmlParserGetDirectory(filename);
    ctxt->directory = pcVar2;
    pxVar3 = xmlNewInputStream(ctxt);
    if (pxVar3 == (xmlParserInputPtr)0x0) {
LAB_00166976:
      xmlFreeParserInputBuffer(in);
      return 1;
    }
    pxVar4 = xmlCanonicPath((xmlChar *)filename);
  }
  pxVar3->filename = (char *)pxVar4;
  pxVar3->buf = in;
  xmlBufResetInput(in->buffer,pxVar3);
  inputPush(ctxt,pxVar3);
  if (((0 < size && chunk != (char *)0x0) &&
      (pxVar3 = ctxt->input, pxVar3 != (xmlParserInputPtr)0x0)) &&
     (pxVar3->buf != (xmlParserInputBufferPtr)0x0)) {
    base = xmlBufGetInputBase(pxVar3->buf->buffer,pxVar3);
    pxVar3 = ctxt->input;
    pxVar4 = pxVar3->cur;
    pxVar1 = pxVar3->base;
    xmlParserInputBufferPush(pxVar3->buf,size,chunk);
    xmlBufSetInputBaseCur(ctxt->input->buf->buffer,ctxt->input,base,(long)pxVar4 - (long)pxVar1);
  }
  if (encoding == (char *)0x0) {
    if (enc != XML_CHAR_ENCODING_NONE) {
      xmlSwitchEncoding(ctxt,enc);
    }
  }
  else {
    if (ctxt->encoding != (xmlChar *)0x0) {
      (*xmlFree)(ctxt->encoding);
    }
    pxVar4 = xmlStrdup((xmlChar *)encoding);
    ctxt->encoding = pxVar4;
    handler = xmlFindCharEncodingHandler(encoding);
    if (handler == (xmlCharEncodingHandlerPtr)0x0) {
      xmlFatalErrMsgStr(ctxt,XML_ERR_UNSUPPORTED_ENCODING,"Unsupported encoding %s\n",
                        (xmlChar *)encoding);
    }
    else {
      xmlSwitchToEncoding(ctxt,handler);
    }
  }
  return 0;
}

Assistant:

int
xmlCtxtResetPush(xmlParserCtxtPtr ctxt, const char *chunk,
                 int size, const char *filename, const char *encoding)
{
    xmlParserInputPtr inputStream;
    xmlParserInputBufferPtr buf;
    xmlCharEncoding enc = XML_CHAR_ENCODING_NONE;

    if (ctxt == NULL)
        return(1);

    if ((encoding == NULL) && (chunk != NULL) && (size >= 4))
        enc = xmlDetectCharEncoding((const xmlChar *) chunk, size);

    buf = xmlAllocParserInputBuffer(enc);
    if (buf == NULL)
        return(1);

    if (ctxt == NULL) {
        xmlFreeParserInputBuffer(buf);
        return(1);
    }

    xmlCtxtReset(ctxt);

    if (filename == NULL) {
        ctxt->directory = NULL;
    } else {
        ctxt->directory = xmlParserGetDirectory(filename);
    }

    inputStream = xmlNewInputStream(ctxt);
    if (inputStream == NULL) {
        xmlFreeParserInputBuffer(buf);
        return(1);
    }

    if (filename == NULL)
        inputStream->filename = NULL;
    else
        inputStream->filename = (char *)
            xmlCanonicPath((const xmlChar *) filename);
    inputStream->buf = buf;
    xmlBufResetInput(buf->buffer, inputStream);

    inputPush(ctxt, inputStream);

    if ((size > 0) && (chunk != NULL) && (ctxt->input != NULL) &&
        (ctxt->input->buf != NULL)) {
	size_t base = xmlBufGetInputBase(ctxt->input->buf->buffer, ctxt->input);
        size_t cur = ctxt->input->cur - ctxt->input->base;

        xmlParserInputBufferPush(ctxt->input->buf, size, chunk);

        xmlBufSetInputBaseCur(ctxt->input->buf->buffer, ctxt->input, base, cur);
#ifdef DEBUG_PUSH
        xmlGenericError(xmlGenericErrorContext, "PP: pushed %d\n", size);
#endif
    }

    if (encoding != NULL) {
        xmlCharEncodingHandlerPtr hdlr;

        if (ctxt->encoding != NULL)
	    xmlFree((xmlChar *) ctxt->encoding);
        ctxt->encoding = xmlStrdup((const xmlChar *) encoding);

        hdlr = xmlFindCharEncodingHandler(encoding);
        if (hdlr != NULL) {
            xmlSwitchToEncoding(ctxt, hdlr);
	} else {
	    xmlFatalErrMsgStr(ctxt, XML_ERR_UNSUPPORTED_ENCODING,
			      "Unsupported encoding %s\n", BAD_CAST encoding);
        }
    } else if (enc != XML_CHAR_ENCODING_NONE) {
        xmlSwitchEncoding(ctxt, enc);
    }

    return(0);
}